

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-01.cpp
# Opt level: O1

void __thiscall
baryonyx::itm::
solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
::solver_inequalities_01coeff
          (solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
           *this,random_engine *rng_,int m_,int n_,cost_type *c_,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts)

{
  uint uVar1;
  pointer pmVar2;
  pointer pfVar3;
  pointer pfVar4;
  FILE *__stream;
  double *pdVar5;
  rc_data *prVar6;
  bound_factor *__s;
  undefined8 extraout_RAX;
  pointer *ppfVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  pointer pfVar11;
  ulong uVar12;
  string_view name;
  
  name._M_str = "solver_inequalities_01coeff";
  name._M_len = 0x1b;
  debug_logger<true>::debug_logger(&this->super_debug_logger<true>,name);
  this->rng = rng_;
  sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(&this->ap,csts,m_,n_);
  uVar12 = (ulong)(this->ap).m_rows_values.m_length << 3;
  pdVar5 = (double *)operator_new__(uVar12);
  memset(pdVar5,0,uVar12);
  (this->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = pdVar5;
  pmVar2 = (csts->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar12 = (long)*(pointer *)
                  ((long)&(pmVar2->elements).
                          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                          ._M_impl + 8) -
           *(long *)&(pmVar2->elements).
                     super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                     ._M_impl >> 3;
  lVar9 = (long)(csts->
                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar2;
  if (lVar9 != 0x28) {
    lVar9 = (lVar9 >> 3) * -0x3333333333333333 + -1;
    ppfVar7 = (pointer *)
              ((long)&pmVar2[1].elements.
                      super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                      ._M_impl + 8);
    do {
      uVar10 = (long)*ppfVar7 - (long)((_Vector_impl_data *)(ppfVar7 + -1))->_M_start >> 3;
      if (uVar12 <= uVar10) {
        uVar12 = uVar10;
      }
      ppfVar7 = ppfVar7 + 5;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  uVar12 = -(ulong)(uVar12 >> 0x3c != 0) | uVar12 << 4;
  prVar6 = (rc_data *)operator_new__(uVar12);
  memset(prVar6,0,uVar12);
  (this->R)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_false>
  ._M_head_impl = prVar6;
  uVar12 = 0xffffffffffffffff;
  if (-1 < m_) {
    uVar12 = (long)m_ << 3;
  }
  __s = (bound_factor *)operator_new__(uVar12);
  memset(__s,0,uVar12);
  (this->b)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::bound_factor[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::bound_factor[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::bound_factor_*,_false>
  ._M_head_impl = __s;
  pdVar5 = (double *)operator_new__(uVar12);
  memset(pdVar5,0,uVar12);
  (this->pi)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = pdVar5;
  this->c = c_;
  this->m = m_;
  this->n = n_;
  if (m_ != 0) {
    pmVar2 = (csts->
             super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar12 = 0;
    do {
      pfVar4 = *(pointer *)
                ((long)&pmVar2[uVar12].elements.
                        super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        ._M_impl + 8);
      pfVar3 = *(pointer *)
                &pmVar2[uVar12].elements.
                 super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                 ._M_impl;
      for (pfVar11 = pfVar3; pfVar11 != pfVar4; pfVar11 = pfVar11 + 1) {
        if (pfVar11->factor != 1) {
          itm::solver_inequalities_01coeff();
          goto LAB_003be5a0;
        }
      }
      uVar1 = pmVar2[uVar12].min;
      uVar8 = pmVar2[uVar12].max;
      if (uVar1 == uVar8) {
        __s[uVar12].min = uVar1;
      }
      else {
        __s[uVar12].min = ~((int)uVar1 >> 0x1f) & uVar1;
        uVar8 = (uint)((ulong)((long)pfVar4 - (long)pfVar3) >> 3);
        if (pmVar2[uVar12].max < (int)uVar8) {
          uVar8 = pmVar2[uVar12].max;
        }
      }
      __s[uVar12].max = uVar8;
      if ((int)uVar8 < __s[uVar12].min) {
LAB_003be5a0:
        itm::solver_inequalities_01coeff();
        operator_delete__(__s);
        (this->b)._M_t.
        super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::bound_factor[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::bound_factor[]>_>
        .
        super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::bound_factor_*,_false>
        ._M_head_impl = (bound_factor *)0x0;
        prVar6 = (this->R)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_false>
                 ._M_head_impl;
        if (prVar6 != (rc_data *)0x0) {
          operator_delete__(prVar6);
        }
        (this->R)._M_t.
        super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
        .
        super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_false>
        ._M_head_impl = (rc_data *)0x0;
        pdVar5 = (this->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl;
        if (pdVar5 != (double *)0x0) {
          operator_delete__(pdVar5);
        }
        (this->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
        super__Head_base<0UL,_double_*,_false>._M_head_impl = (double *)0x0;
        sparse_matrix<int>::~sparse_matrix(&this->ap);
        __stream = (FILE *)(this->super_debug_logger<true>).ofs;
        if (__stream != (FILE *)0x0) {
          fclose(__stream);
        }
        _Unwind_Resume(extraout_RAX);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != (uint)m_);
  }
  return;
}

Assistant:

solver_inequalities_01coeff(random_engine& rng_,
                                int m_,
                                int n_,
                                const cost_type& c_,
                                const std::vector<merged_constraint>& csts)
      : logger("solver_inequalities_01coeff")
      , rng(rng_)
      , ap(csts, m_, n_)
      , P(std::make_unique<Float[]>(ap.size()))
      , R(std::make_unique<rc_data[]>(compute_reduced_costs_vector_size(csts)))
      , b(std::make_unique<bound_factor[]>(m_))
      , pi(std::make_unique<Float[]>(m_))
      , c(c_)
      , m(m_)
      , n(n_)
    {
        for (int i = 0; i != m; ++i) {
#if !defined(BARYONYX_FULL_OPTIMIZATION)
            // mscv 15.9.6 fail to build this line:
            // for ([[maybe_unused]] const auto& cst : csts[i].elements)
            //    bx_ensures(cst.factor == 1);
            for (const auto& cst : csts[i].elements)
                bx_ensures(cst.factor == 1);
#endif

            if (csts[i].min == csts[i].max) {
                b[i].min = csts[i].min;
                b[i].max = csts[i].max;
            } else {
                b[i].min = std::max(0, csts[i].min);
                b[i].max = std::min(length(csts[i].elements), csts[i].max);
            }

            bx_ensures(b[i].min <= b[i].max);
        }
    }